

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l;
  pointer pbVar5;
  long lVar6;
  int iVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  ostringstream ostr;
  RegularExpression handleLeak;
  RegularExpression leak;
  RegularExpression invalidHeapArgument;
  RegularExpression uninitializedRead;
  RegularExpression unaddressableAccess;
  RegularExpression drMemoryError;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f08;
  long *local_ee8 [2];
  long local_ed8 [2];
  undefined1 local_ec8 [376];
  RegularExpression local_d50;
  RegularExpression local_b20;
  RegularExpression local_8f0;
  RegularExpression local_6c0;
  RegularExpression local_490;
  RegularExpression local_260;
  
  local_f08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f08.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&local_f08);
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  cmsys::RegularExpression::compile(&local_260,"^Error #[0-9]+");
  local_490.regmust = (char *)0x0;
  local_490.program = (char *)0x0;
  local_490.progsize = 0;
  memset(&local_490,0,0x20a);
  cmsys::RegularExpression::compile(&local_490,"UNADDRESSABLE ACCESS");
  local_6c0.regmust = (char *)0x0;
  local_6c0.program = (char *)0x0;
  local_6c0.progsize = 0;
  memset(&local_6c0,0,0x20a);
  cmsys::RegularExpression::compile(&local_6c0,"UNINITIALIZED READ");
  local_8f0.regmust = (char *)0x0;
  local_8f0.program = (char *)0x0;
  local_8f0.progsize = 0;
  memset(&local_8f0,0,0x20a);
  cmsys::RegularExpression::compile(&local_8f0,"INVALID HEAP ARGUMENT");
  local_b20.regmust = (char *)0x0;
  local_b20.program = (char *)0x0;
  local_b20.progsize = 0;
  memset(&local_b20,0,0x20a);
  cmsys::RegularExpression::compile(&local_b20,"LEAK");
  local_d50.regmust = (char *)0x0;
  local_d50.program = (char *)0x0;
  local_d50.progsize = 0;
  memset(&local_d50,0,0x20a);
  cmsys::RegularExpression::compile(&local_d50,"HANDLE LEAK");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ec8);
  pbVar2 = local_f08.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar7 = 0;
  if (local_f08.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f08.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_f08.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_ec8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      bVar3 = cmsys::RegularExpression::find
                        (&local_260,(pbVar5->_M_dataplus)._M_p,&local_260.regmatch);
      if (bVar3) {
        bVar3 = cmsys::RegularExpression::find
                          (&local_490,(pbVar5->_M_dataplus)._M_p,&local_490.regmatch);
        iVar7 = iVar7 + 1;
        lVar6 = 0x54;
        if (!bVar3) {
          bVar3 = cmsys::RegularExpression::find
                            (&local_6c0,(pbVar5->_M_dataplus)._M_p,&local_6c0.regmatch);
          if (!bVar3) {
            bVar3 = cmsys::RegularExpression::find
                              (&local_b20,(pbVar5->_M_dataplus)._M_p,&local_b20.regmatch);
            lVar6 = 0x38;
            if (!bVar3) {
              bVar3 = cmsys::RegularExpression::find
                                (&local_d50,(pbVar5->_M_dataplus)._M_p,&local_d50.regmatch);
              if (!bVar3) {
                bVar3 = cmsys::RegularExpression::find
                                  (&local_8f0,(pbVar5->_M_dataplus)._M_p,&local_8f0.regmatch);
                lVar6 = 0x1c;
                if (!bVar3) goto LAB_001ef596;
              }
            }
          }
        }
        piVar1 = (int *)((long)(results->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar6);
        *piVar1 = *piVar1 + 1;
      }
LAB_001ef596:
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)log,(string *)local_ee8);
  if (local_ee8[0] != local_ed8) {
    operator_delete(local_ee8[0],local_ed8[0] + 1);
  }
  this->DefectCount = this->DefectCount + iVar7;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ec8);
  std::ios_base::~ios_base((ios_base *)(local_ec8 + 0x70));
  if (local_d50.program != (char *)0x0) {
    operator_delete__(local_d50.program);
  }
  if (local_b20.program != (char *)0x0) {
    operator_delete__(local_b20.program);
  }
  if (local_8f0.program != (char *)0x0) {
    operator_delete__(local_8f0.program);
  }
  if (local_6c0.program != (char *)0x0) {
    operator_delete__(local_6c0.program);
  }
  if (local_490.program != (char *)0x0) {
    operator_delete__(local_490.program);
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f08);
  return iVar7 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);

  cmsys::RegularExpression drMemoryError("^Error #[0-9]+");

  cmsys::RegularExpression unaddressableAccess("UNADDRESSABLE ACCESS");
  cmsys::RegularExpression uninitializedRead("UNINITIALIZED READ");
  cmsys::RegularExpression invalidHeapArgument("INVALID HEAP ARGUMENT");
  cmsys::RegularExpression leak("LEAK");
  cmsys::RegularExpression handleLeak("HANDLE LEAK");

  int defects = 0;

  std::ostringstream ostr;
  for (const auto& l : lines) {
    ostr << l << std::endl;
    if (drMemoryError.find(l)) {
      defects++;
      if (unaddressableAccess.find(l) || uninitializedRead.find(l)) {
        results[cmCTestMemCheckHandler::UMR]++;
      } else if (leak.find(l) || handleLeak.find(l)) {
        results[cmCTestMemCheckHandler::MLK]++;
      } else if (invalidHeapArgument.find(l)) {
        results[cmCTestMemCheckHandler::FMM]++;
      }
    }
  }

  log = ostr.str();

  this->DefectCount += defects;
  return defects == 0;
}